

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.h
# Opt level: O1

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  ~StyledWriter(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

virtual ~StyledWriter () {}